

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshCubeWeightedSum1(int *pWofChow,int *pChow,char *pIsop,int nVars,int j)

{
  int local_30;
  int local_2c;
  int Cost;
  int k;
  int j_local;
  int nVars_local;
  char *pIsop_local;
  int *pChow_local;
  int *pWofChow_local;
  
  local_30 = 0;
  for (local_2c = j; local_2c < j + nVars; local_2c = local_2c + 1) {
    if (pIsop[local_2c] == '1') {
      local_30 = pWofChow[pChow[local_2c - j]] + local_30;
    }
  }
  return local_30;
}

Assistant:

static inline int Extra_ThreshCubeWeightedSum1(int * pWofChow, int * pChow,
        char * pIsop, int nVars, int j) {
    int k, Cost = 0;
    for (k = j; k < j + nVars; k++)
        if (pIsop[k] == '1')
            Cost += pWofChow[pChow[k - j]];
    return Cost;
}